

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::BayesianProbitRegressor_Gaussian::BayesianProbitRegressor_Gaussian
          (BayesianProbitRegressor_Gaussian *this,BayesianProbitRegressor_Gaussian *from)

{
  ulong uVar1;
  double dVar2;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__BayesianProbitRegressor_Gaussian_004bd688;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  dVar2 = from->precision_;
  this->mean_ = from->mean_;
  this->precision_ = dVar2;
  return;
}

Assistant:

BayesianProbitRegressor_Gaussian::BayesianProbitRegressor_Gaussian(const BayesianProbitRegressor_Gaussian& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  ::memcpy(&mean_, &from.mean_,
    static_cast<size_t>(reinterpret_cast<char*>(&precision_) -
    reinterpret_cast<char*>(&mean_)) + sizeof(precision_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.BayesianProbitRegressor.Gaussian)
}